

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-ft-math.c
# Opt level: O3

void PVG_FT_Vector_Rotate(PVG_FT_Vector *vec,PVG_FT_Angle angle)

{
  uint uVar1;
  long lVar2;
  byte bVar3;
  PVG_FT_Fixed s;
  long lVar4;
  ulong uVar5;
  uint uVar6;
  long lVar7;
  int iVar8;
  PVG_FT_Vector local_28;
  
  local_28.x = vec->x;
  local_28.y = vec->y;
  if (local_28.x != 0 || local_28.y != 0) {
    lVar2 = -local_28.x;
    if (0 < local_28.x) {
      lVar2 = local_28.x;
    }
    lVar7 = -local_28.y;
    if (0 < local_28.y) {
      lVar7 = local_28.y;
    }
    uVar6 = (uint)lVar7 | (uint)lVar2;
    uVar1 = 0x1f;
    if (uVar6 != 0) {
      for (; uVar6 >> uVar1 == 0; uVar1 = uVar1 - 1) {
      }
    }
    if (uVar1 < 0x1e) {
      iVar8 = 0x1d - uVar1;
      local_28.x = local_28.x << ((byte)iVar8 & 0x3f);
      local_28.y = local_28.y << ((byte)iVar8 & 0x3f);
    }
    else {
      iVar8 = (uVar1 ^ 0x1f) - 2;
      bVar3 = 2 - (char)(uVar1 ^ 0x1f);
      local_28.x = local_28.x >> (bVar3 & 0x3f);
      local_28.y = local_28.y >> (bVar3 & 0x3f);
    }
    ft_trig_pseudo_rotate(&local_28,angle);
    lVar2 = -local_28.x;
    if (0 < local_28.x) {
      lVar2 = local_28.x;
    }
    lVar7 = lVar2 * 0xdbd95b16 + 0x100000000 >> 0x20;
    lVar2 = -lVar7;
    if (-1 < local_28.x) {
      lVar2 = lVar7;
    }
    lVar7 = -local_28.y;
    if (0 < local_28.y) {
      lVar7 = local_28.y;
    }
    lVar4 = lVar7 * 0xdbd95b16 + 0x100000000 >> 0x20;
    lVar7 = -lVar4;
    if (-1 < local_28.y) {
      lVar7 = lVar4;
    }
    bVar3 = (byte)iVar8;
    if (iVar8 < 1) {
      vec->x = lVar2 << (-bVar3 & 0x3f);
      lVar7 = lVar7 << (-bVar3 & 0x3f);
    }
    else {
      uVar5 = (ulong)(uint)(1 << (bVar3 - 1 & 0x1f));
      vec->x = (long)((lVar2 >> 0x3f) + lVar2 + uVar5) >> (bVar3 & 0x3f);
      lVar7 = (long)((lVar7 >> 0x3f) + lVar7 + uVar5) >> (bVar3 & 0x3f);
    }
    vec->y = lVar7;
  }
  return;
}

Assistant:

void PVG_FT_Vector_Rotate(PVG_FT_Vector* vec, PVG_FT_Angle angle)
{
    PVG_FT_Int     shift;
    PVG_FT_Vector  v = *vec;

    if ( v.x == 0 && v.y == 0 )
        return;

    shift = ft_trig_prenorm( &v );
    ft_trig_pseudo_rotate( &v, angle );
    v.x = ft_trig_downscale( v.x );
    v.y = ft_trig_downscale( v.y );

    if ( shift > 0 )
    {
        PVG_FT_Int32  half = (PVG_FT_Int32)1L << ( shift - 1 );


        vec->x = ( v.x + half - ( v.x < 0 ) ) >> shift;
        vec->y = ( v.y + half - ( v.y < 0 ) ) >> shift;
    }
    else
    {
        shift  = -shift;
        vec->x = (PVG_FT_Pos)( (PVG_FT_ULong)v.x << shift );
        vec->y = (PVG_FT_Pos)( (PVG_FT_ULong)v.y << shift );
    }
}